

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

float64 float64_gen2(float64 xa,float64 xb,float_status *s,hard_f64_op2_fn hard,soft_f64_op2_fn soft
                    ,f64_check_fn pre,f64_check_fn post,f64_check_fn fast_test,
                    soft_f64_op2_fn fast_op)

{
  _Bool _Var1;
  byte bVar2;
  float64 fVar3;
  undefined7 extraout_var;
  float_status *extraout_RDX;
  float_status *extraout_RDX_00;
  float_status *pfVar4;
  union_float64 uVar5;
  union_float64 uVar6;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  union_float64 ur;
  union_float64 ub;
  union_float64 ua;
  f64_check_fn pre_local;
  soft_f64_op2_fn soft_local;
  hard_f64_op2_fn hard_local;
  float_status *s_local;
  float64 xb_local;
  float64 xa_local;
  
  ur.s = xb;
  ub.s = xa;
  ua = (union_float64)pre;
  pre_local = (f64_check_fn)soft;
  soft_local = (soft_f64_op2_fn)hard;
  hard_local = (hard_f64_op2_fn)s;
  s_local = (float_status *)xb;
  xb_local = xa;
  _Var1 = can_use_fpu(s);
  if (((_Var1 ^ 0xffU) & 1) == 0) {
    float64_input_flush2(&ub.s,&ur.s,(float_status *)hard_local);
    uVar5 = ur;
    uVar6 = ub;
    bVar2 = (*(code *)ua)();
    if (((bVar2 ^ 0xff) & 1) == 0) {
      pfVar4 = extraout_RDX;
      if ((fast_test != (f64_check_fn)0x0) &&
         (uVar5 = ur, uVar6 = ub, _Var1 = (*fast_test)(ub,ur), pfVar4 = extraout_RDX_00, _Var1)) {
        fVar3 = (*fast_op)(ub.s,ur.s,(float_status *)hard_local);
        return fVar3;
      }
      (*soft_local)(uVar6.s,uVar5.s,pfVar4);
      uVar5.s._4_4_ = extraout_XMM0_Db;
      uVar5.s._0_4_ = extraout_XMM0_Da;
      _Var1 = f64_is_inf(uVar5);
      if (_Var1) {
        hard_local[2] = (_func_double_double_double)((byte)hard_local[2] | 8);
        return uVar5.s;
      }
      if (2.2250738585072014e-308 < ABS(uVar5.h)) {
        return uVar5.s;
      }
      if ((post != (f64_check_fn)0x0) && (_Var1 = (*post)(ub,ur), !_Var1)) {
        return uVar5.s;
      }
    }
  }
  _Var1 = (*pre_local)(ub,ur);
  return CONCAT71(extraout_var,_Var1);
}

Assistant:

static inline float64
float64_gen2(float64 xa, float64 xb, float_status *s,
             hard_f64_op2_fn hard, soft_f64_op2_fn soft,
             f64_check_fn pre, f64_check_fn post,
             f64_check_fn fast_test, soft_f64_op2_fn fast_op)
{
    union_float64 ua, ub, ur;

    ua.s = xa;
    ub.s = xb;

    if (unlikely(!can_use_fpu(s))) {
        goto soft;
    }

    float64_input_flush2(&ua.s, &ub.s, s);
    if (unlikely(!pre(ua, ub))) {
        goto soft;
    }
    if (fast_test && fast_test(ua, ub)) {
        return fast_op(ua.s, ub.s, s);
    }

    ur.h = hard(ua.h, ub.h);
    if (unlikely(f64_is_inf(ur))) {
        s->float_exception_flags |= float_flag_overflow;
    } else if (unlikely(fabs(ur.h) <= DBL_MIN)) {
        if (post == NULL || post(ua, ub)) {
            goto soft;
        }
    }
    return ur.s;

 soft:
    return soft(ua.s, ub.s, s);
}